

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingRenderCase::drawAndVerifyResult
          (LayoutBindingRenderCase *this,Vec4 *expectedColor)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PixelFormat *this_00;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  MessageBuilder local_3b8;
  PixelBufferAccess local_238;
  PixelBufferAccess local_210;
  MessageBuilder local_1e8;
  undefined1 local_68 [8];
  Surface result;
  RGBA compareThreshold;
  RGBA local_3c;
  undefined1 local_38 [4];
  RGBA surfaceThreshold;
  Surface reference;
  Functions *gl;
  Vec4 *expectedColor_local;
  LayoutBindingRenderCase *this_local;
  long lVar8;
  
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar2);
  iVar2 = getRenderWidth(this);
  iVar3 = getRenderHeight(this);
  tcu::Surface::Surface((Surface *)local_38,iVar2,iVar3);
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar7->_vptr_RenderContext[4])();
  this_00 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_00,iVar2));
  local_3c = tcu::PixelFormat::getColorThreshold(this_00);
  iVar2 = tcu::RGBA::getRed(&local_3c);
  iVar2 = de::clamp<int>(iVar2 * 2,0,0xff);
  iVar3 = tcu::RGBA::getGreen(&local_3c);
  iVar3 = de::clamp<int>(iVar3 * 2,0,0xff);
  iVar4 = tcu::RGBA::getBlue(&local_3c);
  iVar4 = de::clamp<int>(iVar4 * 2,0,0xff);
  iVar5 = tcu::RGBA::getAlpha(&local_3c);
  iVar5 = de::clamp<int>(iVar5 * 2,0,0xff);
  tcu::RGBA::RGBA((RGBA *)&result.m_pixels.m_cap,iVar2,iVar3,iVar4,iVar5);
  (**(code **)(lVar8 + 0x188))(0x4000);
  (**(code **)(lVar8 + 0x568))(4,6,0x1403,0);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Drawing failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x283);
  iVar2 = getRenderWidth(this);
  iVar3 = getRenderHeight(this);
  tcu::Surface::Surface((Surface *)local_68,iVar2,iVar3);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1e8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [15])"Reading pixels");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_210,(Surface *)local_68);
  glu::readPixels(pRVar7,0,0,&local_210);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Read pixels failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x289);
  tcu::Surface::getAccess(&local_238,(Surface *)local_38);
  tcu::clear(&local_238,expectedColor);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_3b8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_3b8,(char (*) [50])"Verifying output image, fragment output color is "
                      );
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,expectedColor);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3b8);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = tcu::pixelThresholdCompare
                    (pTVar9,"Render result","Result verification",(Surface *)local_38,
                     (Surface *)local_68,(RGBA *)&result.m_pixels.m_cap,COMPARE_LOG_RESULT);
  tcu::Surface::~Surface((Surface *)local_68);
  tcu::Surface::~Surface((Surface *)local_38);
  return bVar1;
}

Assistant:

bool LayoutBindingRenderCase::drawAndVerifyResult (const Vec4& expectedColor)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	tcu::Surface			reference			(getRenderWidth(), getRenderHeight());

	// the point of these test is to check layout_binding. For this purpose, we can use quite
	// large thresholds.
	const tcu::RGBA			surfaceThreshold	= m_context.getRenderContext().getRenderTarget().getPixelFormat().getColorThreshold();
	const tcu::RGBA			compareThreshold	= tcu::RGBA(de::clamp(2 * surfaceThreshold.getRed(),   0, 255),
															de::clamp(2 * surfaceThreshold.getGreen(), 0, 255),
															de::clamp(2 * surfaceThreshold.getBlue(),  0, 255),
															de::clamp(2 * surfaceThreshold.getAlpha(), 0, 255));

	gl.clear(GL_COLOR_BUFFER_BIT);

	// Draw
	gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Drawing failed");

	// Verify
	tcu::Surface result(getRenderWidth(), getRenderHeight());
	m_testCtx.getLog() << TestLog::Message << "Reading pixels" << TestLog::EndMessage;
	glu::readPixels(m_context.getRenderContext(), 0, 0, result.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	tcu::clear(reference.getAccess(), expectedColor);
	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output image, fragment output color is " << expectedColor << tcu::TestLog::EndMessage;

	return tcu::pixelThresholdCompare(m_testCtx.getLog(), "Render result", "Result verification", reference, result, compareThreshold, tcu::COMPARE_LOG_RESULT);
}